

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pagerFixMaplimit(Pager *pPager)

{
  sqlite3_file *psVar1;
  _func_int_Pager_ptr_Pgno_DbPage_ptr_ptr_int *p_Var2;
  code *pcVar3;
  long in_FS_OFFSET;
  sqlite3_int64 sz;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = pPager->fd;
  if ((psVar1->pMethods != (sqlite3_io_methods *)0x0) && (2 < psVar1->pMethods->iVersion)) {
    local_10 = pPager->szMmap;
    pPager->bUseFetch = 0 < local_10;
    pcVar3 = getPageNormal;
    if (0 < local_10) {
      pcVar3 = getPageMMap;
    }
    p_Var2 = getPageError;
    if (pPager->errCode == 0) {
      p_Var2 = pcVar3;
    }
    pPager->xGet = p_Var2;
    if (psVar1->pMethods != (sqlite3_io_methods *)0x0) {
      (*psVar1->pMethods->xFileControl)(psVar1,0x12,&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void pagerFixMaplimit(Pager *pPager){
#if SQLITE_MAX_MMAP_SIZE>0
  sqlite3_file *fd = pPager->fd;
  if( isOpen(fd) && fd->pMethods->iVersion>=3 ){
    sqlite3_int64 sz;
    sz = pPager->szMmap;
    pPager->bUseFetch = (sz>0);
    setGetterMethod(pPager);
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_MMAP_SIZE, &sz);
  }
#endif
}